

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::HasLazyFields
               (Descriptor *descriptor,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  bool bVar1;
  long lVar2;
  MessageSCCAnalyzer *extraout_RDX;
  MessageSCCAnalyzer *extraout_RDX_00;
  MessageSCCAnalyzer *extraout_RDX_01;
  long lVar3;
  long lVar4;
  
  lVar4 = -1;
  lVar3 = 0;
  while (lVar4 = lVar4 + 1, lVar4 < *(int *)(descriptor + 4)) {
    bVar1 = IsLazilyVerifiedLazy((FieldDescriptor *)(lVar3 + *(long *)(descriptor + 0x28)),options);
    scc_analyzer = extraout_RDX;
    lVar3 = lVar3 + 0x48;
    if (bVar1) {
      return true;
    }
  }
  lVar4 = -1;
  lVar3 = 0;
  do {
    lVar4 = lVar4 + 1;
    if (*(int *)(descriptor + 0x7c) <= lVar4) {
      lVar4 = -1;
      lVar3 = 0;
      do {
        lVar2 = (long)*(int *)(descriptor + 0x70);
        lVar4 = lVar4 + 1;
        if (lVar2 <= lVar4) {
          return lVar4 < lVar2;
        }
        bVar1 = HasLazyFields((Descriptor *)(lVar3 + *(long *)(descriptor + 0x38)),options,
                              scc_analyzer);
        scc_analyzer = extraout_RDX_01;
        lVar3 = lVar3 + 0x88;
      } while (!bVar1);
      return lVar4 < lVar2;
    }
    bVar1 = IsLazilyVerifiedLazy((FieldDescriptor *)(lVar3 + *(long *)(descriptor + 0x50)),options);
    scc_analyzer = extraout_RDX_00;
    lVar3 = lVar3 + 0x48;
  } while (!bVar1);
  return true;
}

Assistant:

static bool HasLazyFields(const Descriptor* descriptor, const Options& options,
                          MessageSCCAnalyzer* scc_analyzer) {
  for (int field_idx = 0; field_idx < descriptor->field_count(); field_idx++) {
    if (IsLazy(descriptor->field(field_idx), options, scc_analyzer)) {
      return true;
    }
  }
  for (int idx = 0; idx < descriptor->extension_count(); idx++) {
    if (IsLazy(descriptor->extension(idx), options, scc_analyzer)) {
      return true;
    }
  }
  for (int idx = 0; idx < descriptor->nested_type_count(); idx++) {
    if (HasLazyFields(descriptor->nested_type(idx), options, scc_analyzer)) {
      return true;
    }
  }
  return false;
}